

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O0

void Fx_ManCreateDivisors(Fx_Man_t *p)

{
  int iVar1;
  int iVar2;
  Hsh_VecMan_t *pHVar3;
  Vec_Flt_t *pVVar4;
  Vec_Que_t *pVVar5;
  float **pCosts;
  int local_24;
  int local_20;
  int fWarning;
  int i;
  float Weight;
  Vec_Int_t *vCube;
  Fx_Man_t *p_local;
  
  local_24 = 0;
  vCube = (Vec_Int_t *)p;
  if (p->pHash != (Hsh_VecMan_t *)0x0) {
    __assert_fail("p->pHash == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                  ,0x36d,"void Fx_ManCreateDivisors(Fx_Man_t *)");
  }
  pHVar3 = Hsh_VecManStart(1000);
  *(Hsh_VecMan_t **)(vCube + 2) = pHVar3;
  pVVar4 = Vec_FltAlloc(1000);
  vCube[2].pArray = &pVVar4->nCap;
  for (local_20 = 0; iVar2 = local_20, iVar1 = Vec_WecSize(*(Vec_Wec_t **)vCube), iVar2 < iVar1;
      local_20 = local_20 + 1) {
    _i = Vec_WecEntry(*(Vec_Wec_t **)vCube,local_20);
    Fx_ManCubeSingleCubeDivisors((Fx_Man_t *)vCube,_i,0,0);
  }
  iVar2 = vCube[9].nCap;
  iVar1 = Vec_FltSize((Vec_Flt_t *)vCube[2].pArray);
  if (iVar2 != iVar1) {
    __assert_fail("p->nDivsS == Vec_FltSize(p->vWeights)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                  ,0x373,"void Fx_ManCreateDivisors(Fx_Man_t *)");
  }
  for (local_20 = 0; iVar2 = local_20, iVar1 = Vec_WecSize(*(Vec_Wec_t **)vCube), iVar2 < iVar1;
      local_20 = local_20 + 1) {
    _i = Vec_WecEntry(*(Vec_Wec_t **)vCube,local_20);
    Fx_ManCubeDoubleCubeDivisors((Fx_Man_t *)vCube,local_20 + 1,_i,0,0,&local_24);
  }
  iVar2 = Vec_FltSize((Vec_Flt_t *)vCube[2].pArray);
  pVVar5 = Vec_QueAlloc(iVar2);
  *(Vec_Que_t **)(vCube + 3) = pVVar5;
  pVVar5 = *(Vec_Que_t **)(vCube + 3);
  pCosts = Vec_FltArrayP((Vec_Flt_t *)vCube[2].pArray);
  Vec_QueSetPriority(pVVar5,pCosts);
  for (local_20 = 0; iVar2 = local_20, iVar1 = Vec_FltSize((Vec_Flt_t *)vCube[2].pArray),
      iVar2 < iVar1; local_20 = local_20 + 1) {
    fWarning = (int)Vec_FltEntry((Vec_Flt_t *)vCube[2].pArray,local_20);
    if (0.0 < (float)fWarning) {
      Vec_QuePush(*(Vec_Que_t **)(vCube + 3),local_20);
    }
  }
  return;
}

Assistant:

void Fx_ManCreateDivisors( Fx_Man_t * p )
{
    Vec_Int_t * vCube;
    float Weight;
    int i, fWarning = 0;
    // alloc hash table
    assert( p->pHash == NULL );
    p->pHash = Hsh_VecManStart( 1000 );
    p->vWeights = Vec_FltAlloc( 1000 );
    // create single-cube two-literal divisors
    Vec_WecForEachLevel( p->vCubes, vCube, i )
        Fx_ManCubeSingleCubeDivisors( p, vCube, 0, 0 ); // add - no update
    assert( p->nDivsS == Vec_FltSize(p->vWeights) );
    // create two-cube divisors
    Vec_WecForEachLevel( p->vCubes, vCube, i )
        Fx_ManCubeDoubleCubeDivisors( p, i+1, vCube, 0, 0, &fWarning ); // add - no update
    // create queue with all divisors
    p->vPrio = Vec_QueAlloc( Vec_FltSize(p->vWeights) );
    Vec_QueSetPriority( p->vPrio, Vec_FltArrayP(p->vWeights) );
    Vec_FltForEachEntry( p->vWeights, Weight, i )
        if ( Weight > 0.0 )
            Vec_QuePush( p->vPrio, i );
}